

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQueue.cpp
# Opt level: O2

int test2(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_00;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_01;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_02;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_03;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_04;
  thread consumer3Thr;
  thread consumer6Thr;
  thread consumer5Thr;
  thread consumer4Thr;
  thread consumer2Thr;
  thread consumer1Thr;
  vector<int,_std::allocator<int>_> firstPart;
  thread prodThr;
  Producer prod;
  vector<int,_std::allocator<int>_> secondPart;
  duration<long,_std::ratio<1L,_1000L>_> local_250;
  Consumer cons5;
  Consumer cons3;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer5and6;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer5and6;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer3and4;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer3and4;
  Consumer cons2;
  Consumer cons1;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer1and2;
  int local_14c;
  Consumer cons6;
  Consumer cons4;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer1and2;
  Queue<int> q;
  
  std::operator<<((ostream *)&std::cout,"\n ---------------- Second Test ----------------\n");
  std::operator<<((ostream *)&std::cout,"OUTPUT: Consumers 1 and 2 read messages from 1 to 100\n");
  std::operator<<((ostream *)&std::cout,"        Consumers 3 and 4 approximatively from 50 to 100\n"
                 );
  std::operator<<((ostream *)&std::cout,"        Consumers 5 and 6 approximatively from 1 to 50\n\n"
                 );
  rtb::Concurrency::Queue<int>::Queue(&q);
  unsubscribeTimeConsumer1and2.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  __l._M_len = 1;
  __l._M_array = (iterator)&unsubscribeTimeConsumer1and2;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&subscribeTimeConsumer1and2,__l,(allocator_type *)&subscribeTimeConsumer3and4);
  subscribeTimeConsumer3and4.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&subscribeTimeConsumer3and4;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&unsubscribeTimeConsumer1and2,__l_00,(allocator_type *)&unsubscribeTimeConsumer3and4);
  unsubscribeTimeConsumer3and4.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1f4;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&unsubscribeTimeConsumer3and4;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&subscribeTimeConsumer3and4,__l_01,(allocator_type *)&subscribeTimeConsumer5and6);
  subscribeTimeConsumer5and6.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&subscribeTimeConsumer5and6;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&unsubscribeTimeConsumer3and4,__l_02,(allocator_type *)&unsubscribeTimeConsumer5and6);
  unsubscribeTimeConsumer5and6.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&unsubscribeTimeConsumer5and6;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&subscribeTimeConsumer5and6,__l_03,(allocator_type *)&prod);
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x1fe;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&prod;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&unsubscribeTimeConsumer5and6,__l_04,(allocator_type *)&cons1);
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  consumer1Thr._M_id._M_thread = (id)10;
  consumer2Thr._M_id._M_thread = (id)10;
  consumer3Thr._M_id._M_thread._0_4_ = 100;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&prod;
  std::thread::
  thread<std::reference_wrapper<Producer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>,int,void>
            (&prodThr,(reference_wrapper<Producer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer1Thr,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer2Thr,(int *)&consumer3Thr);
  consumer3Thr._M_id._M_thread._0_4_ = 1;
  consumer2Thr._M_id._M_thread = (id)0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons1;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer1Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,(int *)&consumer3Thr,
             &subscribeTimeConsumer1and2,&unsubscribeTimeConsumer1and2,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer2Thr);
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons2;
  consumer4Thr._M_id._M_thread._0_4_ = 2;
  consumer3Thr._M_id._M_thread = (id)0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer2Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,(int *)&consumer4Thr,
             &subscribeTimeConsumer1and2,&unsubscribeTimeConsumer1and2,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer3Thr);
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons3;
  consumer5Thr._M_id._M_thread._0_4_ = 3;
  consumer4Thr._M_id._M_thread = (id)0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer3Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,(int *)&consumer5Thr,
             &subscribeTimeConsumer3and4,&unsubscribeTimeConsumer3and4,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer4Thr);
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons4;
  consumer6Thr._M_id._M_thread._0_4_ = 4;
  consumer5Thr._M_id._M_thread = (id)0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer4Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,(int *)&consumer6Thr,
             &subscribeTimeConsumer3and4,&unsubscribeTimeConsumer3and4,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer5Thr);
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons5;
  local_250.__r._0_4_ = 5;
  consumer6Thr._M_id._M_thread = (id)0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer5Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,(int *)&local_250,
             &subscribeTimeConsumer5and6,&unsubscribeTimeConsumer5and6,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer6Thr);
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&cons6;
  local_14c = 6;
  local_250.__r = 0;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer6Thr,(reference_wrapper<Consumer> *)&secondPart,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&firstPart,&local_14c,
             &subscribeTimeConsumer5and6,&unsubscribeTimeConsumer5and6,&local_250);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  bVar1 = std::operator==(&prod.producedValues,&cons1.consumedValues);
  if (bVar1) {
    bVar1 = std::operator==(&prod.producedValues,&cons2.consumedValues);
  }
  else {
    bVar1 = false;
  }
  uVar4 = (long)cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&secondPart,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start +
             (((ulong)((long)prod.producedValues.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)prod.producedValues.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2) - uVar4)),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&firstPart);
  bVar2 = std::operator==(&secondPart,&cons3.consumedValues);
  uVar5 = (long)cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&firstPart,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int *)((long)prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + uVar5),(allocator_type *)&local_250);
  bVar3 = std::operator==(&firstPart,&cons5.consumedValues);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&firstPart.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&secondPart.super__Vector_base<int,_std::allocator<int>_>);
  std::thread::~thread(&consumer6Thr);
  std::thread::~thread(&consumer5Thr);
  std::thread::~thread(&consumer4Thr);
  std::thread::~thread(&consumer3Thr);
  std::thread::~thread(&consumer2Thr);
  std::thread::~thread(&consumer1Thr);
  std::thread::~thread(&prodThr);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons6);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons5);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&prod);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&unsubscribeTimeConsumer5and6.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&subscribeTimeConsumer5and6.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&unsubscribeTimeConsumer3and4.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&subscribeTimeConsumer3and4.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&unsubscribeTimeConsumer1and2.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&subscribeTimeConsumer1and2.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  rtb::Concurrency::Queue<int>::~Queue(&q);
  return (uint)(byte)(uVar5 < 0xdc & bVar1 & bVar2 & 0x2d < uVar4 & bVar3);
}

Assistant:

int test2() {
    // SECOND TEST
    // Producer start first (at 10) and send 100 msg with a period of 10
    // Consumer 1 and 2 subscribe before (at 5),
    // Consumer 3 and 4 subscribe after (at 500) and read half of the messages
    // Consumer 5 and 6 subscribe before (at 5) andn leave in the middle
    // OUTPUT: Consumers 1 and 2 100 messages
    //         Consumers 3 and 4 roughly the last half of the messages
    //         Consumers 5 and 6 roughly the first half of the messages

    std::cout << "\n ---------------- Second Test ----------------\n";
    std::cout << "OUTPUT: Consumers 1 and 2 read messages from 1 to 100\n";
    std::cout << "        Consumers 3 and 4 approximatively from 50 to 100\n";
    std::cout << "        Consumers 5 and 6 approximatively from 1 to 50\n\n";

    Queue<int> q;

    std::vector<TimeT> subscribeTimeConsumer1and2 = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTimeConsumer1and2 = { TimeT{ 1500 } };
    std::vector<TimeT> subscribeTimeConsumer3and4 = { TimeT{ 500 } };
    std::vector<TimeT> unsubscribeTimeConsumer3and4 = { TimeT{ 1500 } };
    std::vector<TimeT> subscribeTimeConsumer5and6 = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTimeConsumer5and6 = { TimeT{ 510 } };

    Producer prod;
    Consumer cons1, cons2, cons3, cons4, cons5, cons6;

    // producer thread
    std::thread prodThr(ref(prod), ref(q), TimeT{ 10 }, TimeT{ 10 }, 100);

    // consumer threads
    std::thread consumer1Thr(ref(cons1),
        ref(q),
        1,
        subscribeTimeConsumer1and2,
        unsubscribeTimeConsumer1and2,
        TimeT{ 0 });

    std::thread consumer2Thr(ref(cons2),
        ref(q),
        2,
        subscribeTimeConsumer1and2,
        unsubscribeTimeConsumer1and2,
        TimeT{ 0 });
    std::thread consumer3Thr(ref(cons3),
        ref(q),
        3,
        subscribeTimeConsumer3and4,
        unsubscribeTimeConsumer3and4,
        TimeT{ 0 });
    std::thread consumer4Thr(ref(cons4),
        ref(q),
        4,
        subscribeTimeConsumer3and4,
        unsubscribeTimeConsumer3and4,
        TimeT{ 0 });
    std::thread consumer5Thr(ref(cons5),
        ref(q),
        5,
        subscribeTimeConsumer5and6,
        unsubscribeTimeConsumer5and6,
        TimeT{ 0 });
    std::thread consumer6Thr(ref(cons6),
        ref(q),
        6,
        subscribeTimeConsumer5and6,
        unsubscribeTimeConsumer5and6,
        TimeT{ 0 });

    prodThr.join();
    consumer1Thr.join();
    consumer2Thr.join();
    consumer3Thr.join();
    consumer4Thr.join();
    consumer5Thr.join();
    consumer6Thr.join();

    bool success = true;
    //
    success = (prod.producedValues == cons1.consumedValues)
              && (prod.producedValues == cons2.consumedValues);

    size_t c3Size = cons3.consumedValues.size();
    success &= (c3Size > 45);
    size_t pSize = prod.producedValues.size();
    std::vector<int> secondPart(
        prod.producedValues.begin() + (pSize - c3Size), prod.producedValues.end());
    success &= (secondPart == cons3.consumedValues);

    size_t c5Size = cons5.consumedValues.size();
    success &= (c5Size < 55);
    std::vector<int> firstPart(prod.producedValues.begin(), prod.producedValues.begin() + c5Size);
    success &= (firstPart == cons5.consumedValues);

    return success;
}